

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall QRhiResourceUpdateBatch::~QRhiResourceUpdateBatch(QRhiResourceUpdateBatch *this)

{
  undefined8 *in_RDI;
  QRhiResourceUpdateBatchPrivate *this_00;
  
  this_00 = (QRhiResourceUpdateBatchPrivate *)*in_RDI;
  if (this_00 != (QRhiResourceUpdateBatchPrivate *)0x0) {
    QRhiResourceUpdateBatchPrivate::~QRhiResourceUpdateBatchPrivate(this_00);
    operator_delete(this_00,0x13c58);
  }
  return;
}

Assistant:

QRhiResourceUpdateBatch::~QRhiResourceUpdateBatch()
{
    delete d;
}